

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_advance_uint32_iterator(roaring_uint32_iterator_t *it)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  _Bool _Var5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  ulong uVar9;
  
  iVar3 = it->container_index;
  if (iVar3 < (it->parent->high_low_container).size) {
    if (iVar3 < 0) {
      it->container_index = 0;
    }
    else {
      if (it->typecode == '\x03') {
        uVar8 = it->current_value;
        if (uVar8 == 0xffffffff) goto LAB_00119f5f;
        lVar4 = *(long *)((long)it->container + 8);
        lVar11 = (long)it->run_index;
        uVar1 = *(ushort *)(lVar4 + lVar11 * 4);
        uVar2 = *(ushort *)(lVar4 + 2 + lVar11 * 4);
        it->current_value = uVar8 + 1;
        if (uVar8 < ((uint)uVar2 + (uint)uVar1 | it->highbits)) {
LAB_00119fef:
          it->has_value = true;
          return true;
        }
        iVar13 = it->run_index + 1;
        it->run_index = iVar13;
        if (iVar13 < *it->container) {
          it->current_value = it->highbits | (uint)*(ushort *)(lVar4 + 4 + lVar11 * 4);
          goto LAB_00119fef;
        }
      }
      else if (it->typecode == '\x02') {
        iVar13 = it->in_container_index;
        iVar10 = iVar13 + 1;
        it->in_container_index = iVar10;
        if (iVar10 < *it->container) {
          it->current_value =
               (uint)*(ushort *)(*(long *)((long)it->container + 8) + 2 + (long)iVar13 * 2) |
               it->highbits;
          goto LAB_00119fef;
        }
      }
      else {
        iVar10 = it->in_container_index;
        iVar13 = iVar10 + 1;
        iVar7 = iVar10 + 0x40;
        if (-1 < iVar13) {
          iVar7 = iVar13;
        }
        it->in_container_index = iVar13;
        uVar8 = iVar7 >> 6;
        uVar9 = (ulong)uVar8;
        if (uVar8 < 0x400) {
          bVar6 = (char)iVar10 + 1;
          lVar4 = *(long *)((long)it->container + 8);
          uVar12 = (*(ulong *)(lVar4 + (ulong)uVar8 * 8) >> (bVar6 & 0x3f)) << (bVar6 & 0x3f);
          uVar14 = (ulong)uVar8;
          if (iVar10 - 0xffffU < 0xffffffc0 && uVar12 == 0) {
            do {
              uVar9 = uVar14 + 1;
              uVar12 = *(ulong *)(lVar4 + 8 + uVar14 * 8);
              if (uVar12 != 0) break;
              bVar15 = uVar14 < 0x3fe;
              uVar14 = uVar9;
            } while (bVar15);
          }
          if (uVar12 != 0) {
            lVar4 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar8 = (uint)lVar4 | (int)uVar9 << 6;
            it->in_container_index = uVar8;
            it->current_value = uVar8 | it->highbits;
            goto LAB_00119fef;
          }
        }
      }
      it->container_index = iVar3 + 1;
    }
    _Var5 = loadfirstvalue(it);
    it->has_value = _Var5;
  }
  else {
LAB_00119f5f:
    it->has_value = false;
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool roaring_advance_uint32_iterator(roaring_uint32_iterator_t *it) {
    if (it->container_index >= it->parent->high_low_container.size) {
        return (it->has_value = false);
    }
    if (it->container_index < 0) {
        it->container_index = 0;
        return (it->has_value = loadfirstvalue(it));
    }

    switch (it->typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(it->container);
            it->in_container_index++;

            uint32_t wordindex = it->in_container_index / 64;
            if (wordindex >= BITSET_CONTAINER_SIZE_IN_WORDS) break;

            uint64_t word = bc->words[wordindex] &
                   (UINT64_MAX << (it->in_container_index % 64));
            // next part could be optimized/simplified
            while ((word == 0) &&
                   (wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS)) {
                wordindex++;
                word = bc->words[wordindex];
            }
            if (word != 0) {
                it->in_container_index = wordindex * 64 + __builtin_ctzll(word);
                it->current_value = it->highbits | it->in_container_index;
                return (it->has_value = true);
            }
            break; }

        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(it->container);
            it->in_container_index++;
            if (it->in_container_index < ac->cardinality) {
                it->current_value =
                        it->highbits | ac->array[it->in_container_index];
                return (it->has_value = true);
            }
            break; }

        case RUN_CONTAINER_TYPE: {
            if(it->current_value == UINT32_MAX) {  // avoid overflow to zero
                return (it->has_value = false);
            }

            const run_container_t* rc = const_CAST_run(it->container);
            uint32_t limit = (it->highbits | (rc->runs[it->run_index].value +
                                              rc->runs[it->run_index].length));
            if (++it->current_value <= limit) {
                return (it->has_value = true);
            }

            if (++it->run_index < rc->n_runs) {  // Assume the run has a value
                it->current_value =
                        it->highbits | rc->runs[it->run_index].value;
                return (it->has_value = true);
            }
            break;
        }

        default:
            __builtin_unreachable();
    }

    // moving to next container
    it->container_index++;
    return (it->has_value = loadfirstvalue(it));
}